

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O1

void __thiscall
google::protobuf::internal::ExtensionSet::SetAllocatedMessage
          (ExtensionSet *this,int number,FieldType type,FieldDescriptor *descriptor,
          MessageLite *message)

{
  byte bVar1;
  Arena *pAVar2;
  int iVar3;
  LogMessage *pLVar4;
  undefined4 extraout_var;
  Extension *pEVar6;
  pair<google::protobuf::internal::ExtensionSet::Extension_*,_bool> pVar7;
  LogMessage local_e8;
  LogMessage local_b0;
  LogMessage local_78;
  Arena *local_40;
  LogFinisher local_31;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pRVar5;
  
  if (message == (MessageLite *)0x0) {
    pEVar6 = FindOrNull(this,number);
    if (pEVar6 == (Extension *)0x0) {
      return;
    }
    Extension::Clear(pEVar6);
    return;
  }
  local_40 = (Arena *)(message->_internal_metadata_).ptr_;
  if (((ulong)local_40 & 1) != 0) {
    local_40 = *(Arena **)((ulong)local_40 & 0xfffffffffffffffe);
  }
  pVar7 = Insert(this,number);
  pEVar6 = pVar7.first;
  pEVar6->descriptor = descriptor;
  if (((undefined1  [16])pVar7 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    if (pEVar6->is_repeated != false) {
      LogMessage::LogMessage
                (&local_b0,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O1/src/src/google/protobuf/extension_set.cc"
                 ,0x285);
      pLVar4 = LogMessage::operator<<
                         (&local_b0,
                          "CHECK failed: ((*extension).is_repeated ? REPEATED_FIELD : OPTIONAL_FIELD) == (OPTIONAL_FIELD): "
                         );
      LogFinisher::operator=((LogFinisher *)&local_78,pLVar4);
      LogMessage::~LogMessage(&local_b0);
    }
    bVar1 = pEVar6->type;
    if ((byte)(bVar1 - 0x13) < 0xee) {
      LogMessage::LogMessage
                (&local_78,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O1/src/src/google/protobuf/extension_set.cc"
                 ,0x3c);
      pLVar4 = LogMessage::operator<<
                         (&local_78,
                          "CHECK failed: type > 0 && type <= WireFormatLite::MAX_FIELD_TYPE: ");
      LogFinisher::operator=((LogFinisher *)&local_e8,pLVar4);
      LogMessage::~LogMessage(&local_78);
    }
    if (*(int *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)bVar1 * 4) != 10) {
      LogMessage::LogMessage
                (&local_e8,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O1/src/src/google/protobuf/extension_set.cc"
                 ,0x285);
      pLVar4 = LogMessage::operator<<
                         (&local_e8,
                          "CHECK failed: (cpp_type((*extension).type)) == (WireFormatLite::CPPTYPE_MESSAGE): "
                         );
      LogFinisher::operator=(&local_31,pLVar4);
      LogMessage::~LogMessage(&local_e8);
    }
    pAVar2 = local_40;
    if ((pEVar6->field_0xa & 0x10) != 0) {
      (*(code *)(((((pEVar6->field_0).repeated_string_value)->super_RepeatedPtrFieldBase).arena_)->
                impl_).options_.start_block_size)((pEVar6->field_0).repeated_string_value,message);
      goto LAB_0021609c;
    }
    if ((this->arena_ == (Arena *)0x0) &&
       ((pEVar6->field_0).repeated_string_value !=
        (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)0x0)) {
      (*(code *)(((((pEVar6->field_0).repeated_string_value)->super_RepeatedPtrFieldBase).arena_)->
                impl_).hint_._M_b._M_p)();
    }
    if (pAVar2 == this->arena_) goto LAB_0021608b;
  }
  else {
    pEVar6->type = type;
    if ((byte)(type - 0x13) < 0xee) {
      LogMessage::LogMessage
                (&local_78,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O1/src/src/google/protobuf/extension_set.cc"
                 ,0x3c);
      pLVar4 = LogMessage::operator<<
                         (&local_78,
                          "CHECK failed: type > 0 && type <= WireFormatLite::MAX_FIELD_TYPE: ");
      LogFinisher::operator=((LogFinisher *)&local_b0,pLVar4);
      LogMessage::~LogMessage(&local_78);
    }
    if (*(int *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)type * 4) != 10) {
      LogMessage::LogMessage
                (&local_b0,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O1/src/src/google/protobuf/extension_set.cc"
                 ,0x278);
      pLVar4 = LogMessage::operator<<
                         (&local_b0,
                          "CHECK failed: (cpp_type(extension->type)) == (WireFormatLite::CPPTYPE_MESSAGE): "
                         );
      LogFinisher::operator=((LogFinisher *)&local_e8,pLVar4);
      LogMessage::~LogMessage(&local_b0);
    }
    pEVar6->is_repeated = false;
    pEVar6->field_0xa = pEVar6->field_0xa & 0xf;
    pAVar2 = local_40;
    if (local_40 == this->arena_) {
LAB_0021608b:
      (pEVar6->field_0).message_value = message;
      goto LAB_0021609c;
    }
  }
  if (pAVar2 == (Arena *)0x0) {
    (pEVar6->field_0).message_value = message;
    Arena::Own<google::protobuf::MessageLite>(this->arena_,message);
  }
  else {
    iVar3 = (*message->_vptr_MessageLite[4])(message);
    pRVar5 = (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)CONCAT44(extraout_var,iVar3);
    (pEVar6->field_0).repeated_string_value = pRVar5;
    (*(code *)(((pRVar5->super_RepeatedPtrFieldBase).arena_)->impl_).options_.initial_block_size)
              (pRVar5,message);
  }
LAB_0021609c:
  pEVar6->field_0xa = pEVar6->field_0xa & 0xf0;
  return;
}

Assistant:

void ExtensionSet::SetAllocatedMessage(int number, FieldType type,
                                       const FieldDescriptor* descriptor,
                                       MessageLite* message) {
  if (message == NULL) {
    ClearExtension(number);
    return;
  }
  Arena* message_arena = message->GetArena();
  Extension* extension;
  if (MaybeNewExtension(number, descriptor, &extension)) {
    extension->type = type;
    GOOGLE_DCHECK_EQ(cpp_type(extension->type), WireFormatLite::CPPTYPE_MESSAGE);
    extension->is_repeated = false;
    extension->is_lazy = false;
    if (message_arena == arena_) {
      extension->message_value = message;
    } else if (message_arena == NULL) {
      extension->message_value = message;
      arena_->Own(message);  // not NULL because not equal to message_arena
    } else {
      extension->message_value = message->New(arena_);
      extension->message_value->CheckTypeAndMergeFrom(*message);
    }
  } else {
    GOOGLE_DCHECK_TYPE(*extension, OPTIONAL_FIELD, MESSAGE);
    if (extension->is_lazy) {
      extension->lazymessage_value->SetAllocatedMessage(message);
    } else {
      if (arena_ == NULL) {
        delete extension->message_value;
      }
      if (message_arena == arena_) {
        extension->message_value = message;
      } else if (message_arena == NULL) {
        extension->message_value = message;
        arena_->Own(message);  // not NULL because not equal to message_arena
      } else {
        extension->message_value = message->New(arena_);
        extension->message_value->CheckTypeAndMergeFrom(*message);
      }
    }
  }
  extension->is_cleared = false;
}